

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_alignment_engine_implementation.hpp
# Opt level: O0

void __thiscall
spoa::SimdAlignmentEngine<(spoa::Architecture)3>::
Initialize<spoa::InstructionSet<(spoa::Architecture)3,short>>
          (SimdAlignmentEngine<(spoa::Architecture)3> *this,char *sequence,Graph *graph,
          uint64_t normal_matrix_width,uint64_t matrix_width,uint64_t matrix_height)

{
  __mxxxi *palVar1;
  value_type vVar2;
  value_type vVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  bool bVar9;
  uint32_t uVar10;
  int iVar11;
  int *piVar12;
  int *__b;
  pointer pIVar13;
  ulong uVar14;
  size_type sVar15;
  const_reference ppNVar16;
  reference pvVar17;
  reference pvVar18;
  reference __b_00;
  reference ppEVar19;
  ulong in_RCX;
  Graph *in_RDX;
  long in_RSI;
  __mxxxi *palVar20;
  long in_RDI;
  ulong in_R8;
  ulong in_R9;
  longlong in_XMM0_Qa;
  longlong lVar28;
  longlong lVar30;
  __mxxxi alVar21;
  __mxxxi alVar22;
  undefined1 auVar23 [32];
  __mxxxi alVar24;
  __mxxxi alVar25;
  longlong in_XMM0_Qb;
  longlong lVar27;
  longlong lVar29;
  undefined1 auVar26 [64];
  undefined1 auVar31 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar32 [64];
  uint32_t i_8;
  uint32_t k_4;
  __mxxxi g_1;
  uint32_t j_9;
  uint32_t j_8;
  uint32_t j_7;
  uint32_t k_3;
  __mxxxi g;
  uint32_t j_6;
  uint32_t pred_i_2;
  Edge **it_2;
  const_iterator __end5;
  const_iterator __begin5;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *__range5;
  int32_t penalty_2;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *edges_2;
  uint32_t i_7;
  uint32_t j_5;
  uint32_t i_6;
  uint32_t j_4;
  uint32_t i_5;
  uint32_t i_4;
  uint32_t j_3;
  uint32_t pred_i_1;
  Edge **it_1;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *__range4_1;
  int32_t penalty_1;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *edges_1;
  uint32_t i_3;
  uint32_t k_2;
  __mxxxi e;
  uint32_t j_2;
  uint32_t pred_i;
  Edge **it;
  const_iterator __end4;
  const_iterator __begin4;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *__range4;
  int32_t penalty;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *edges;
  uint32_t i_2;
  uint32_t k_1;
  __mxxxi c_1;
  uint32_t j_1;
  __mxxxi zeroes;
  __mxxxi negative_infinities;
  type kNegativeInfinity;
  uint32_t i_1;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *rank_to_node;
  uint32_t k;
  uint32_t j;
  char c;
  uint32_t i;
  type unpacked [16];
  int32_t padding_penatly;
  __mxxxi *palVar33;
  type_conflict a;
  __mxxxi in_stack_fffffffffffff940;
  longlong local_680;
  longlong lStack_678;
  longlong lStack_670;
  longlong lStack_668;
  longlong local_5a0;
  longlong lStack_598;
  longlong lStack_590;
  longlong lStack_588;
  int local_564;
  int local_4a4;
  int local_404;
  short local_2c4;
  char local_2bd;
  uint local_2a8;
  uint local_2a4;
  __mxxxi local_2a0;
  uint local_270;
  uint local_26c;
  uint local_268;
  uint local_264;
  __mxxxi local_260;
  uint local_230;
  __normal_iterator<spoa::Graph::Edge_*const_*,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
  local_220;
  __normal_iterator<spoa::Graph::Edge_*const_*,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
  local_218;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *local_210;
  int local_204;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *local_200;
  uint local_1f8;
  uint local_1f4;
  uint local_1f0;
  uint local_1ec;
  uint local_1e8;
  uint local_1e4;
  uint local_1e0;
  uint local_1dc;
  reference local_1d8;
  __normal_iterator<spoa::Graph::Edge_*const_*,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
  local_1d0;
  __normal_iterator<spoa::Graph::Edge_*const_*,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
  local_1c8;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *local_1c0;
  int local_1b4;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *local_1b0;
  uint local_1a8;
  uint local_1a4;
  __mxxxi local_1a0;
  uint local_180;
  uint local_17c;
  reference local_178;
  __normal_iterator<spoa::Graph::Edge_*const_*,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
  local_170;
  __normal_iterator<spoa::Graph::Edge_*const_*,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
  local_168;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *local_160;
  int local_154;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *local_150;
  uint local_148;
  uint local_144;
  __mxxxi local_140;
  uint local_104;
  undefined1 local_100 [32];
  longlong local_e0;
  longlong lStack_d8;
  longlong lStack_d0;
  longlong lStack_c8;
  short local_be;
  uint local_bc;
  vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> *local_b8;
  uint local_b0;
  uint local_ac;
  uint8_t local_a5;
  uint local_a4;
  longlong local_a0 [5];
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  Graph *local_48;
  long local_40;
  
  local_68 = (int)*(char *)(in_RDI + 0x10);
  if (local_68 < 1) {
    local_68 = -local_68;
  }
  local_6c = (int)*(char *)(in_RDI + 0x11);
  if (local_6c < 1) {
    local_6c = -local_6c;
  }
  local_60 = in_R9;
  local_58 = in_R8;
  local_50 = in_RCX;
  local_48 = in_RDX;
  local_40 = in_RSI;
  piVar12 = std::max<int>(&local_68,&local_6c);
  local_70 = (int)*(char *)(in_RDI + 0x12);
  if (local_70 < 1) {
    local_70 = -local_70;
  }
  local_74 = (int)*(char *)(in_RDI + 0x14);
  if (local_74 < 1) {
    local_74 = -local_74;
  }
  __b = std::max<int>(&local_70,&local_74);
  piVar12 = std::max<int>(piVar12,__b);
  local_64 = -*piVar12;
  memset(local_a0,0,0x20);
  local_a4 = 0;
  while( true ) {
    uVar8 = local_a4;
    lVar27 = 0;
    lVar29 = 0;
    in_ZMM1 = ZEXT1664(in_ZMM1._0_16_);
    uVar10 = Graph::num_codes(local_48);
    if (uVar10 <= uVar8) break;
    palVar20 = (__mxxxi *)(ulong)(local_a4 & 0xff);
    local_a5 = Graph::decoder(local_48,(uint8_t)local_a4);
    for (local_ac = 0; auVar31 = in_ZMM1._0_16_, local_ac < local_58; local_ac = local_ac + 1) {
      for (local_b0 = 0; local_b0 < 0x10; local_b0 = local_b0 + 1) {
        if (local_ac * 0x10 + local_b0 < local_50) {
          if (local_a5 == *(uint8_t *)(local_40 + (ulong)(local_ac * 0x10 + local_b0))) {
            local_2bd = *(char *)(in_RDI + 0x10);
          }
          else {
            local_2bd = *(char *)(in_RDI + 0x11);
          }
          local_2c4 = (short)local_2bd;
        }
        else {
          local_2c4 = (short)local_64;
        }
        *(short *)((long)local_a0 + (ulong)local_b0 * 2) = local_2c4;
      }
      _mmxxx_load_si((__mxxxi *)local_a0,palVar20);
      in_ZMM1 = ZEXT1664(auVar31);
      pIVar13 = std::
                unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                              *)(in_RDI + 0x18));
      palVar33 = pIVar13->sequence_profile + local_a4 * local_58 + (ulong)local_ac;
      (*palVar33)[0] = in_XMM0_Qa;
      (*palVar33)[1] = in_XMM0_Qb;
      (*palVar33)[2] = lVar27;
      (*palVar33)[3] = lVar29;
    }
    local_a4 = local_a4 + 1;
  }
  local_b8 = Graph::rank_to_node(local_48);
  for (local_bc = 0; uVar14 = (ulong)local_bc,
      sVar15 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::size
                         (local_b8), uVar8 = local_bc, uVar14 < sVar15; local_bc = local_bc + 1) {
    pIVar13 = std::
              unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
              ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                            *)(in_RDI + 0x18));
    ppNVar16 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::operator[]
                         (local_b8,(ulong)local_bc);
    pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (&pIVar13->node_id_to_rank,(ulong)(*ppNVar16)->id);
    *pvVar17 = uVar8;
  }
  local_be = std::numeric_limits<short>::min();
  local_be = local_be + 0x400;
  a = in_stack_fffffffffffff940[2]._4_2_;
  InstructionSet<(spoa::Architecture)3,_short>::_mmxxx_set1_epi(a);
  local_e0 = in_XMM0_Qa;
  lStack_d8 = in_XMM0_Qb;
  lStack_d0 = lVar27;
  lStack_c8 = lVar29;
  InstructionSet<(spoa::Architecture)3,_short>::_mmxxx_set1_epi(a);
  local_100._8_8_ = in_XMM0_Qb;
  local_100._0_8_ = in_XMM0_Qa;
  local_100._16_8_ = lVar27;
  local_100._24_8_ = lVar29;
  auVar26 = ZEXT3264(local_100);
  iVar11 = *(int *)(in_RDI + 0xc);
  palVar20 = in_stack_fffffffffffff940[1];
  palVar33 = in_stack_fffffffffffff940[2];
  if (iVar11 != 0) {
    if (iVar11 != 1) {
      if (iVar11 != 2) goto LAB_0013d3ef;
      for (local_104 = 0; lVar30 = lStack_c8, lVar28 = lStack_d0, lVar29 = lStack_d8,
          lVar27 = local_e0, auVar31 = in_ZMM1._0_16_, local_104 < local_58;
          local_104 = local_104 + 1) {
        pIVar13 = std::
                  unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                *)(in_RDI + 0x18));
        palVar1 = pIVar13->O + local_104;
        (*palVar1)[0] = lVar27;
        (*palVar1)[1] = lVar29;
        (*palVar1)[2] = lVar28;
        (*palVar1)[3] = lVar30;
        InstructionSet<(spoa::Architecture)3,_short>::_mmxxx_set1_epi(a);
        in_ZMM1 = ZEXT1664(auVar31);
        pIVar13 = std::
                  unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                *)(in_RDI + 0x18));
        palVar1 = pIVar13->Q + local_104;
        (*palVar1)[0] = lVar27;
        (*palVar1)[1] = lVar29;
        (*palVar1)[2] = lVar28;
        (*palVar1)[3] = lVar30;
        InstructionSet<(spoa::Architecture)3,_short>::_mmxxx_set1_epi(a);
        alVar21[1] = lVar29;
        alVar21[0] = lVar27;
        alVar21[2] = lVar28;
        alVar21[3] = lVar30;
        local_140 = alVar21;
        for (local_144 = 1; auVar26 = ZEXT3264((undefined1  [32])alVar21), local_144 < 0x10;
            local_144 = local_144 + 1) {
          auVar23 = vperm2i128_avx2(in_ZMM1._0_32_,(undefined1  [32])local_140,0x28);
          local_140 = (__mxxxi)vpalignr_avx2((undefined1  [32])local_140,auVar23,0xe);
          alVar21 = (__mxxxi)ZEXT1632(local_140._0_16_);
          auVar31 = auVar23._0_16_;
          std::
          unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
          ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                        *)(in_RDI + 0x18));
          InstructionSet<(spoa::Architecture)3,_short>::_mmxxx_add_epi(palVar33,palVar20);
          in_ZMM1 = ZEXT1664(auVar31);
          pIVar13 = std::
                    unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                  *)(in_RDI + 0x18));
          pIVar13->Q[local_104] = alVar21;
        }
      }
      auVar26 = ZEXT1664(auVar26._0_16_);
      in_ZMM1 = ZEXT1664(auVar31);
      pIVar13 = std::
                unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                              *)(in_RDI + 0x18));
      pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                          (&pIVar13->first_column,local_60 << 1);
      *pvVar18 = 0;
      for (local_148 = 1; local_148 < local_60; local_148 = local_148 + 1) {
        ppNVar16 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::
                   operator[](local_b8,(ulong)(local_148 - 1));
        local_150 = &(*ppNVar16)->inedges;
        bVar9 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::empty
                          (local_150);
        if (bVar9) {
          local_404 = (int)*(char *)(in_RDI + 0x14) - (int)*(char *)(in_RDI + 0x15);
        }
        else {
          local_404 = (int)local_be;
        }
        local_154 = local_404;
        local_160 = local_150;
        local_168._M_current =
             (Edge **)std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::begin
                                (local_150);
        local_170._M_current =
             (Edge **)std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::end
                                (local_160);
        while (bVar9 = __gnu_cxx::operator!=(&local_168,&local_170), bVar9) {
          local_178 = __gnu_cxx::
                      __normal_iterator<spoa::Graph::Edge_*const_*,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
                      ::operator*(&local_168);
          pIVar13 = std::
                    unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                  *)(in_RDI + 0x18));
          pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (&pIVar13->node_id_to_rank,(ulong)(*local_178)->tail->id);
          local_17c = *pvVar17 + 1;
          pIVar13 = std::
                    unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                  *)(in_RDI + 0x18));
          pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pIVar13->first_column,local_60 * 2 + (ulong)local_17c);
          piVar12 = std::max<int>(&local_154,pvVar18);
          local_154 = *piVar12;
          __gnu_cxx::
          __normal_iterator<spoa::Graph::Edge_*const_*,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
          ::operator++(&local_168);
        }
        iVar11 = local_154 + *(char *)(in_RDI + 0x15);
        pIVar13 = std::
                  unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                *)(in_RDI + 0x18));
        pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                            (&pIVar13->first_column,local_60 * 2 + (ulong)local_148);
        *pvVar18 = iVar11;
      }
    }
    for (local_180 = 0; lVar30 = lStack_c8, lVar28 = lStack_d0, lVar29 = lStack_d8,
        lVar27 = local_e0, auVar31 = in_ZMM1._0_16_, local_180 < local_58; local_180 = local_180 + 1
        ) {
      pIVar13 = std::
                unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                              *)(in_RDI + 0x18));
      palVar1 = pIVar13->F + local_180;
      (*palVar1)[0] = lVar27;
      (*palVar1)[1] = lVar29;
      (*palVar1)[2] = lVar28;
      (*palVar1)[3] = lVar30;
      InstructionSet<(spoa::Architecture)3,_short>::_mmxxx_set1_epi(a);
      in_ZMM1 = ZEXT1664(auVar31);
      pIVar13 = std::
                unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                              *)(in_RDI + 0x18));
      palVar1 = pIVar13->E + local_180;
      (*palVar1)[0] = lVar27;
      (*palVar1)[1] = lVar29;
      (*palVar1)[2] = lVar28;
      (*palVar1)[3] = lVar30;
      InstructionSet<(spoa::Architecture)3,_short>::_mmxxx_set1_epi(a);
      alVar22[1] = lVar29;
      alVar22[0] = lVar27;
      alVar22[2] = lVar28;
      alVar22[3] = lVar30;
      local_1a0 = alVar22;
      for (local_1a4 = 1; auVar26 = ZEXT3264((undefined1  [32])alVar22), local_1a4 < 0x10;
          local_1a4 = local_1a4 + 1) {
        auVar23 = vperm2i128_avx2(in_ZMM1._0_32_,(undefined1  [32])local_1a0,0x28);
        local_1a0 = (__mxxxi)vpalignr_avx2((undefined1  [32])local_1a0,auVar23,0xe);
        alVar22 = (__mxxxi)ZEXT1632(local_1a0._0_16_);
        auVar31 = auVar23._0_16_;
        std::
        unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
        ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      *)(in_RDI + 0x18));
        InstructionSet<(spoa::Architecture)3,_short>::_mmxxx_add_epi(palVar33,palVar20);
        in_ZMM1 = ZEXT1664(auVar31);
        pIVar13 = std::
                  unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                *)(in_RDI + 0x18));
        pIVar13->E[local_180] = alVar22;
      }
    }
    auVar26 = ZEXT1664(auVar26._0_16_);
    in_ZMM1 = ZEXT1664(auVar31);
    pIVar13 = std::
              unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
              ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                            *)(in_RDI + 0x18));
    pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](&pIVar13->first_column,local_60);
    *pvVar18 = 0;
    for (local_1a8 = 1; local_1a8 < local_60; local_1a8 = local_1a8 + 1) {
      ppNVar16 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::operator[]
                           (local_b8,(ulong)(local_1a8 - 1));
      local_1b0 = &(*ppNVar16)->inedges;
      bVar9 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::empty
                        (local_1b0);
      if (bVar9) {
        local_4a4 = (int)*(char *)(in_RDI + 0x12) - (int)*(char *)(in_RDI + 0x13);
      }
      else {
        local_4a4 = (int)local_be;
      }
      local_1b4 = local_4a4;
      local_1c0 = local_1b0;
      local_1c8._M_current =
           (Edge **)std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::begin
                              (local_1b0);
      local_1d0._M_current =
           (Edge **)std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::end
                              (local_1c0);
      while (bVar9 = __gnu_cxx::operator!=(&local_1c8,&local_1d0), bVar9) {
        local_1d8 = __gnu_cxx::
                    __normal_iterator<spoa::Graph::Edge_*const_*,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
                    ::operator*(&local_1c8);
        pIVar13 = std::
                  unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                *)(in_RDI + 0x18));
        pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            (&pIVar13->node_id_to_rank,(ulong)(*local_1d8)->tail->id);
        local_1dc = *pvVar17 + 1;
        pIVar13 = std::
                  unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                *)(in_RDI + 0x18));
        pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                            (&pIVar13->first_column,local_60 + local_1dc);
        piVar12 = std::max<int>(&local_1b4,pvVar18);
        local_1b4 = *piVar12;
        __gnu_cxx::
        __normal_iterator<spoa::Graph::Edge_*const_*,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
        ::operator++(&local_1c8);
      }
      iVar11 = local_1b4 + *(char *)(in_RDI + 0x13);
      pIVar13 = std::
                unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                              *)(in_RDI + 0x18));
      pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                          (&pIVar13->first_column,local_60 + local_1a8);
      *pvVar18 = iVar11;
    }
  }
LAB_0013d3ef:
  iVar11 = *(int *)(in_RDI + 8);
  if (iVar11 == 0) {
    for (local_1e0 = 0; local_1e0 < local_58; local_1e0 = local_1e0 + 1) {
      uVar4 = local_100._0_8_;
      uVar5 = local_100._8_8_;
      uVar6 = local_100._16_8_;
      uVar7 = local_100._24_8_;
      pIVar13 = std::
                unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                              *)(in_RDI + 0x18));
      palVar20 = pIVar13->H + local_1e0;
      (*palVar20)[0] = uVar4;
      (*palVar20)[1] = uVar5;
      (*palVar20)[2] = uVar6;
      (*palVar20)[3] = uVar7;
    }
    for (local_1e4 = 0; local_1e4 < local_60; local_1e4 = local_1e4 + 1) {
      pIVar13 = std::
                unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                              *)(in_RDI + 0x18));
      pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                          (&pIVar13->first_column,(ulong)local_1e4);
      *pvVar18 = 0;
    }
  }
  else if (iVar11 == 1) {
    iVar11 = *(int *)(in_RDI + 0xc);
    if (iVar11 == 0) {
      auVar26 = ZEXT1664(auVar26._0_16_);
      auVar32 = ZEXT1664(in_ZMM1._0_16_);
      pIVar13 = std::
                unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                              *)(in_RDI + 0x18));
      pvVar18 = std::vector<int,_std::allocator<int>_>::operator[](&pIVar13->first_column,0);
      *pvVar18 = 0;
      for (local_1f8 = 1; local_1f8 < local_60; local_1f8 = local_1f8 + 1) {
        ppNVar16 = std::vector<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::
                   operator[](local_b8,(ulong)(local_1f8 - 1));
        local_200 = &(*ppNVar16)->inedges;
        bVar9 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::empty
                          (local_200);
        if (bVar9) {
          local_564 = 0;
        }
        else {
          local_564 = (int)local_be;
        }
        local_204 = local_564;
        local_210 = local_200;
        local_218._M_current =
             (Edge **)std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::begin
                                (local_200);
        local_220._M_current =
             (Edge **)std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::end
                                (local_210);
        while (bVar9 = __gnu_cxx::operator!=(&local_218,&local_220), bVar9) {
          ppEVar19 = __gnu_cxx::
                     __normal_iterator<spoa::Graph::Edge_*const_*,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
                     ::operator*(&local_218);
          pIVar13 = std::
                    unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                  *)(in_RDI + 0x18));
          pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                              (&pIVar13->node_id_to_rank,(ulong)(*ppEVar19)->tail->id);
          vVar3 = *pvVar17;
          pIVar13 = std::
                    unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                  *)(in_RDI + 0x18));
          pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                              (&pIVar13->first_column,(ulong)(vVar3 + 1));
          piVar12 = std::max<int>(&local_204,pvVar18);
          local_204 = *piVar12;
          __gnu_cxx::
          __normal_iterator<spoa::Graph::Edge_*const_*,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
          ::operator++(&local_218);
        }
        iVar11 = local_204 + *(char *)(in_RDI + 0x12);
        pIVar13 = std::
                  unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                *)(in_RDI + 0x18));
        pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                            (&pIVar13->first_column,(ulong)local_1f8);
        *pvVar18 = iVar11;
      }
      local_230 = 0;
      while( true ) {
        auVar31 = auVar32._0_16_;
        auVar23 = auVar26._0_32_;
        if (local_58 <= local_230) break;
        InstructionSet<(spoa::Architecture)3,_short>::_mmxxx_set1_epi(a);
        auVar32 = ZEXT1664(auVar31);
        pIVar13 = std::
                  unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                *)(in_RDI + 0x18));
        local_5a0 = auVar23._0_8_;
        lStack_598 = auVar23._8_8_;
        lStack_590 = auVar23._16_8_;
        lStack_588 = auVar23._24_8_;
        palVar1 = pIVar13->H + local_230;
        (*palVar1)[0] = local_5a0;
        (*palVar1)[1] = lStack_598;
        (*palVar1)[2] = lStack_590;
        (*palVar1)[3] = lStack_588;
        InstructionSet<(spoa::Architecture)3,_short>::_mmxxx_set1_epi(a);
        alVar24[1] = lStack_598;
        alVar24[0] = local_5a0;
        alVar24[2] = lStack_590;
        alVar24[3] = lStack_588;
        local_260 = alVar24;
        for (local_264 = 1; auVar26 = ZEXT3264((undefined1  [32])alVar24), local_264 < 0x10;
            local_264 = local_264 + 1) {
          auVar23 = vperm2i128_avx2(auVar32._0_32_,(undefined1  [32])local_260,0x28);
          local_260 = (__mxxxi)vpalignr_avx2((undefined1  [32])local_260,auVar23,0xe);
          alVar24 = (__mxxxi)ZEXT1632(local_260._0_16_);
          auVar31 = auVar23._0_16_;
          std::
          unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
          ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                        *)(in_RDI + 0x18));
          InstructionSet<(spoa::Architecture)3,_short>::_mmxxx_add_epi(palVar33,palVar20);
          auVar32 = ZEXT1664(auVar31);
          pIVar13 = std::
                    unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                  *)(in_RDI + 0x18));
          pIVar13->H[local_230] = alVar24;
        }
        local_230 = local_230 + 1;
      }
    }
    else if (iVar11 == 1) {
      for (local_1f0 = 0; local_1f0 < local_60; local_1f0 = local_1f0 + 1) {
        pIVar13 = std::
                  unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                *)(in_RDI + 0x18));
        pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                            (&pIVar13->first_column,local_60 + local_1f0);
        vVar2 = *pvVar18;
        pIVar13 = std::
                  unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                *)(in_RDI + 0x18));
        pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                            (&pIVar13->first_column,(ulong)local_1f0);
        *pvVar18 = vVar2;
      }
      for (local_1f4 = 0; local_1f4 < local_58; local_1f4 = local_1f4 + 1) {
        pIVar13 = std::
                  unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                *)(in_RDI + 0x18));
        palVar20 = pIVar13->E + local_1f4;
        lVar27 = (*palVar20)[0];
        lVar29 = (*palVar20)[1];
        lVar28 = (*palVar20)[2];
        lVar30 = (*palVar20)[3];
        pIVar13 = std::
                  unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                *)(in_RDI + 0x18));
        palVar20 = pIVar13->H + local_1f4;
        (*palVar20)[0] = lVar27;
        (*palVar20)[1] = lVar29;
        (*palVar20)[2] = lVar28;
        (*palVar20)[3] = lVar30;
      }
    }
    else if (iVar11 == 2) {
      for (local_1e8 = 0; local_1e8 < local_60; local_1e8 = local_1e8 + 1) {
        auVar26 = ZEXT1664(auVar26._0_16_);
        pIVar13 = std::
                  unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                *)(in_RDI + 0x18));
        pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                            (&pIVar13->first_column,local_60 + local_1e8);
        pIVar13 = std::
                  unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                *)(in_RDI + 0x18));
        __b_00 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&pIVar13->first_column,local_60 * 2 + (ulong)local_1e8);
        piVar12 = std::max<int>(pvVar18,__b_00);
        iVar11 = *piVar12;
        pIVar13 = std::
                  unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                *)(in_RDI + 0x18));
        pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                            (&pIVar13->first_column,(ulong)local_1e8);
        *pvVar18 = iVar11;
      }
      for (local_1ec = 0; local_1ec < local_58; local_1ec = local_1ec + 1) {
        alVar21 = (__mxxxi)ZEXT1632(auVar26._0_16_);
        std::
        unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
        ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      *)(in_RDI + 0x18));
        std::
        unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
        ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      *)(in_RDI + 0x18));
        InstructionSet<(spoa::Architecture)3,_short>::_mmxxx_max_epi(palVar33,palVar20);
        pIVar13 = std::
                  unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                *)(in_RDI + 0x18));
        auVar26 = ZEXT3264((undefined1  [32])alVar21);
        pIVar13->H[local_1ec] = alVar21;
      }
    }
  }
  else if (iVar11 == 2) {
    iVar11 = *(int *)(in_RDI + 0xc);
    if (iVar11 == 0) {
      local_270 = 0;
      while( true ) {
        auVar31 = in_ZMM1._0_16_;
        auVar23 = auVar26._0_32_;
        if (local_58 <= local_270) break;
        InstructionSet<(spoa::Architecture)3,_short>::_mmxxx_set1_epi
                  (in_stack_fffffffffffff940[2]._4_2_);
        in_ZMM1 = ZEXT1664(auVar31);
        pIVar13 = std::
                  unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                *)(in_RDI + 0x18));
        local_680 = auVar23._0_8_;
        lStack_678 = auVar23._8_8_;
        lStack_670 = auVar23._16_8_;
        lStack_668 = auVar23._24_8_;
        palVar20 = pIVar13->H + local_270;
        (*palVar20)[0] = local_680;
        (*palVar20)[1] = lStack_678;
        (*palVar20)[2] = lStack_670;
        (*palVar20)[3] = lStack_668;
        InstructionSet<(spoa::Architecture)3,_short>::_mmxxx_set1_epi
                  (in_stack_fffffffffffff940[2]._4_2_);
        alVar25[1] = lStack_678;
        alVar25[0] = local_680;
        alVar25[2] = lStack_670;
        alVar25[3] = lStack_668;
        local_2a0 = alVar25;
        for (local_2a4 = 1; auVar26 = ZEXT3264((undefined1  [32])alVar25), local_2a4 < 0x10;
            local_2a4 = local_2a4 + 1) {
          auVar23 = vperm2i128_avx2(in_ZMM1._0_32_,(undefined1  [32])local_2a0,0x28);
          local_2a0 = (__mxxxi)vpalignr_avx2((undefined1  [32])local_2a0,auVar23,0xe);
          alVar25 = (__mxxxi)ZEXT1632(local_2a0._0_16_);
          auVar31 = auVar23._0_16_;
          std::
          unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
          ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                        *)(in_RDI + 0x18));
          InstructionSet<(spoa::Architecture)3,_short>::_mmxxx_add_epi
                    (in_stack_fffffffffffff940[2],in_stack_fffffffffffff940[1]);
          in_ZMM1 = ZEXT1664(auVar31);
          pIVar13 = std::
                    unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                    ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                  *)(in_RDI + 0x18));
          pIVar13->H[local_270] = alVar25;
          in_stack_fffffffffffff940 = alVar25;
        }
        local_270 = local_270 + 1;
      }
    }
    else if (iVar11 == 1) {
      for (local_26c = 0; local_26c < local_58; local_26c = local_26c + 1) {
        pIVar13 = std::
                  unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                *)(in_RDI + 0x18));
        palVar20 = pIVar13->E + local_26c;
        lVar27 = (*palVar20)[0];
        lVar29 = (*palVar20)[1];
        lVar28 = (*palVar20)[2];
        lVar30 = (*palVar20)[3];
        pIVar13 = std::
                  unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                *)(in_RDI + 0x18));
        palVar20 = pIVar13->H + local_26c;
        (*palVar20)[0] = lVar27;
        (*palVar20)[1] = lVar29;
        (*palVar20)[2] = lVar28;
        (*palVar20)[3] = lVar30;
      }
    }
    else if (iVar11 == 2) {
      for (local_268 = 0; local_268 < local_58; local_268 = local_268 + 1) {
        alVar21 = (__mxxxi)ZEXT1632(auVar26._0_16_);
        std::
        unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
        ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      *)(in_RDI + 0x18));
        std::
        unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
        ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                      *)(in_RDI + 0x18));
        InstructionSet<(spoa::Architecture)3,_short>::_mmxxx_max_epi(palVar33,palVar20);
        pIVar13 = std::
                  unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                  ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                                *)(in_RDI + 0x18));
        auVar26 = ZEXT3264((undefined1  [32])alVar21);
        pIVar13->H[local_268] = alVar21;
      }
    }
    for (local_2a8 = 0; local_2a8 < local_60; local_2a8 = local_2a8 + 1) {
      pIVar13 = std::
                unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                ::operator->((unique_ptr<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation,_std::default_delete<spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Implementation>_>
                              *)(in_RDI + 0x18));
      pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                          (&pIVar13->first_column,(ulong)local_2a8);
      *pvVar18 = 0;
    }
  }
  return;
}

Assistant:

void SimdAlignmentEngine<A>::Initialize(
    const char* sequence,
    const Graph& graph,
    std::uint64_t normal_matrix_width,
    std::uint64_t matrix_width,
    std::uint64_t matrix_height) noexcept {
#if defined(__AVX2__) || defined(__SSE4_1__) || defined(SPOA_USE_SIMDE)
  std::int32_t padding_penatly = -1 * std::max(
      std::max(abs(m_), abs(n_)),
      std::max(abs(g_), abs(q_)));

  __attribute__((aligned(kRegisterSize / 8))) typename T::type unpacked[T::kNumVar] = {};  // NOLINT

  for (std::uint32_t i = 0; i < graph.num_codes(); ++i) {
    char c = graph.decoder(i);
    for (std::uint32_t j = 0; j < matrix_width; ++j) {
      for (std::uint32_t k = 0; k < T::kNumVar; ++k) {
        unpacked[k] = (j * T::kNumVar + k) < normal_matrix_width ?
            (c == sequence[j * T::kNumVar + k] ? m_ : n_) : padding_penatly;
      }
      pimpl_->sequence_profile[i * matrix_width + j] =
          _mmxxx_load_si(reinterpret_cast<const __mxxxi*>(unpacked));
    }
  }

  const auto& rank_to_node = graph.rank_to_node();
  for (std::uint32_t i = 0; i < rank_to_node.size(); ++i) {
    pimpl_->node_id_to_rank[rank_to_node[i]->id] = i;
  }

  typename T::type kNegativeInfinity =
      std::numeric_limits<typename T::type>::min() + 1024;

  __mxxxi negative_infinities = T::_mmxxx_set1_epi(kNegativeInfinity);
  __mxxxi zeroes = T::_mmxxx_set1_epi(0);

  // initialize secondary matrices
  switch (subtype_) {
    case AlignmentSubtype::kConvex:
      for (std::uint32_t j = 0; j < matrix_width; ++j) {
        pimpl_->O[j] = negative_infinities;
        pimpl_->Q[j] = T::_mmxxx_set1_epi(q_ + j * T::kNumVar * c_);

        __mxxxi c = T::_mmxxx_set1_epi(c_);
        for (std::uint32_t k = 1; k < T::kNumVar; ++k) {
          c = _mmxxx_slli_si(c, T::kLSS);
          pimpl_->Q[j] = T::_mmxxx_add_epi(pimpl_->Q[j], c);
        }
      }
      pimpl_->first_column[2 * matrix_height] = 0;
      for (std::uint32_t i = 1; i < matrix_height; ++i) {
        const auto& edges = rank_to_node[i - 1]->inedges;
        std::int32_t penalty = edges.empty() ? q_ - c_ : kNegativeInfinity;
        for (const auto& it : edges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;
          penalty = std::max(penalty, pimpl_->first_column[2 * matrix_height + pred_i]);  // NOLINT
        }
        pimpl_->first_column[2 * matrix_height + i] = penalty + c_;
      }
      // fall through
    case AlignmentSubtype::kAffine:
      for (std::uint32_t j = 0; j < matrix_width; ++j) {
        pimpl_->F[j] = negative_infinities;
        pimpl_->E[j] = T::_mmxxx_set1_epi(g_ + j * T::kNumVar * e_);

        __mxxxi e = T::_mmxxx_set1_epi(e_);
        for (std::uint32_t k = 1; k < T::kNumVar; ++k) {
          e = _mmxxx_slli_si(e, T::kLSS);
          pimpl_->E[j] = T::_mmxxx_add_epi(pimpl_->E[j], e);
        }
      }
      pimpl_->first_column[matrix_height] = 0;
      for (std::uint32_t i = 1; i < matrix_height; ++i) {
        const auto& edges = rank_to_node[i - 1]->inedges;
        std::int32_t penalty = edges.empty() ? g_ - e_ : kNegativeInfinity;
        for (const auto& it : edges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;
          penalty = std::max(penalty, pimpl_->first_column[matrix_height + pred_i]);  // NOLINT
        }
        pimpl_->first_column[matrix_height + i] = penalty + e_;
      }
      // fall through
    case AlignmentSubtype::kLinear:
      break;
    default:
      break;
  }

  // initialize primary matrix
  switch (type_) {
    case AlignmentType::kSW:
      for (std::uint32_t j = 0; j < matrix_width; ++j) {
        pimpl_->H[j] = zeroes;
      }
      for (std::uint32_t i = 0; i < matrix_height; ++i) {
        pimpl_->first_column[i] = 0;
      }
      break;
    case AlignmentType::kNW:
      switch (subtype_) {
        case AlignmentSubtype::kConvex:
          for (std::uint32_t i = 0; i < matrix_height; ++i) {
            pimpl_->first_column[i] = std::max(
                pimpl_->first_column[matrix_height + i],
                pimpl_->first_column[2 * matrix_height + i]);
          }
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = T::_mmxxx_max_epi(pimpl_->E[j], pimpl_->Q[j]);
          }
          break;
        case AlignmentSubtype::kAffine:
          for (std::uint32_t i = 0; i < matrix_height; ++i) {
            pimpl_->first_column[i] = pimpl_->first_column[matrix_height + i];
          }
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = pimpl_->E[j];
          }
          break;
        case AlignmentSubtype::kLinear:
          pimpl_->first_column[0] = 0;
          for (std::uint32_t i = 1; i < matrix_height; ++i) {
            const auto& edges = rank_to_node[i - 1]->inedges;
            std::int32_t penalty = edges.empty() ? 0 : kNegativeInfinity;
            for (const auto& it : edges) {
              std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;
              penalty = std::max(penalty, pimpl_->first_column[pred_i]);
            }
            pimpl_->first_column[i] = penalty + g_;
          }
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = T::_mmxxx_set1_epi(g_ + j * T::kNumVar * g_);
            __mxxxi g = T::_mmxxx_set1_epi(g_);

            for (std::uint32_t k = 1; k < T::kNumVar; ++k) {
              g = _mmxxx_slli_si(g, T::kLSS);
              pimpl_->H[j] = T::_mmxxx_add_epi(pimpl_->H[j], g);
            }
          }
        default:
          break;
      }
      break;
    case AlignmentType::kOV:
      switch (subtype_) {
        case AlignmentSubtype::kConvex:
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = T::_mmxxx_max_epi(pimpl_->E[j],
            pimpl_->Q[j]);
          }
          break;
        case AlignmentSubtype::kAffine:
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = pimpl_->E[j];
          }
          break;
        case AlignmentSubtype::kLinear:
          for (std::uint32_t j = 0; j < matrix_width; ++j) {
            pimpl_->H[j] = T::_mmxxx_set1_epi(g_ + j * T::kNumVar * g_);
            __mxxxi g = T::_mmxxx_set1_epi(g_);

            for (std::uint32_t k = 1; k < T::kNumVar; ++k) {
              g = _mmxxx_slli_si(g, T::kLSS);
              pimpl_->H[j] = T::_mmxxx_add_epi(pimpl_->H[j], g);
            }
          }
          break;
        default:
          break;
      }
      for (std::uint32_t i = 0; i < matrix_height; ++i) {
        pimpl_->first_column[i] = 0;
      }
      break;
    default:
      break;
  }
#endif
  (void) sequence;
  (void) graph;
  (void) normal_matrix_width;
  (void) matrix_width;
  (void) matrix_height;
}